

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inclusive_scan.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  value_type vVar2;
  reference pvVar3;
  rep rVar4;
  ostream *poVar5;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> this;
  uint *puVar6;
  runtime_error *this_00;
  long in_RSI;
  undefined1 *__stat_loc;
  int in_EDI;
  size_t i_1;
  time_point end_1;
  time_point beg_1;
  time_point end;
  time_point beg;
  size_t i;
  vector<int,_std::allocator<int>_> scan_par;
  vector<int,_std::allocator<int>_> scan_seq;
  vector<int,_std::allocator<int>_> elements;
  Taskflow taskflow;
  Executor executor;
  size_t N;
  size_t W;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbd8;
  Taskflow *in_stack_fffffffffffffbe0;
  size_type sVar7;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  uint uVar8;
  allocator_type *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  Taskflow *in_stack_fffffffffffffc00;
  size_type local_360;
  duration<long,_std::ratio<1L,_1000000000L>_> local_350;
  undefined8 local_348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffcc8;
  size_t in_stack_fffffffffffffcd0;
  Executor *in_stack_fffffffffffffcd8;
  FlowBuilder local_320 [2];
  int *local_310;
  int *local_308;
  int *local_300;
  undefined8 local_2f8;
  rep local_2f0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2e8;
  undefined8 local_2e0;
  int *local_2d8;
  int *local_2c8;
  int *local_2c0;
  int *local_2b8;
  undefined8 local_2b0;
  size_type local_2a8;
  vector<int,_std::allocator<int>_> local_298;
  vector<int,_std::allocator<int>_> local_278;
  vector<int,_std::allocator<int>_> local_258;
  undefined1 local_240 [232];
  undefined1 local_158 [312];
  ulong local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI != 3) {
    std::operator<<((ostream *)&std::cerr,"usage: ./inclusive_scan num_workers num_elements\n");
    exit(1);
  }
  local_10 = in_RSI;
  iVar1 = atoi(*(char **)(in_RSI + 8));
  local_18 = (long)iVar1;
  iVar1 = atoi(*(char **)(local_10 + 0x10));
  local_20 = (ulong)iVar1;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffcc8._M_pi);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x105963);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffc00);
  std::allocator<int>::allocator((allocator<int> *)0x105997);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00,
             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),in_stack_fffffffffffffbf0
            );
  std::allocator<int>::~allocator((allocator<int> *)0x1059c3);
  std::allocator<int>::allocator((allocator<int> *)0x1059e8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00,
             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),in_stack_fffffffffffffbf0
            );
  std::allocator<int>::~allocator((allocator<int> *)0x105a14);
  std::allocator<int>::allocator((allocator<int> *)0x105a39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00,
             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),in_stack_fffffffffffffbf0
            );
  std::allocator<int>::~allocator((allocator<int> *)0x105a65);
  for (local_2a8 = 0; local_2a8 < local_20; local_2a8 = local_2a8 + 1) {
    vVar2 = (value_type)local_2a8;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_258,local_2a8);
    *pvVar3 = vVar2;
  }
  std::operator<<((ostream *)&std::cout,"sequential inclusive scan ... ");
  local_2b0 = std::chrono::_V2::steady_clock::now();
  local_2b8 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffbd8);
  local_2c0 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffbd8);
  local_2c8 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffbd8);
  local_2d8 = (int *)std::
                     inclusive_scan<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::multiplies<int>>
                               (local_2b8,local_2c0,local_2c8);
  local_2e0 = std::chrono::_V2::steady_clock::now();
  local_2f0 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                              (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffbe0);
  local_2e8.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffbd8);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_2e8);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,rVar4);
  std::operator<<(poVar5,"ns\n");
  std::operator<<((ostream *)&std::cout,"parallel   inclusive scan ... ");
  local_2f8 = std::chrono::_V2::steady_clock::now();
  local_300 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffbd8);
  local_308 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffbd8);
  local_310 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffbd8);
  tf::FlowBuilder::
  inclusive_scan<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::multiplies<int>>
            (local_320,local_240,local_300,local_308,local_310);
  __stat_loc = local_158;
  tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                    in_stack_fffffffffffffbe0);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffcc0,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffbe0);
  local_348 = std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffbe0);
  this = std::chrono::
         duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                   ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffbd8);
  local_350.__r = this.__r;
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_350);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,rVar4);
  std::operator<<(poVar5,"ns\n");
  local_360 = 0;
  while( true ) {
    if (local_20 <= local_360) {
      printf("correct result\n");
      local_4 = 0;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0);
      tf::Taskflow::~Taskflow(in_stack_fffffffffffffbe0);
      tf::Executor::~Executor((Executor *)this.__r);
      return local_4;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_278,local_360);
    vVar2 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_298,local_360);
    if (vVar2 != *pvVar3) break;
    local_360 = local_360 + 1;
  }
  sVar7 = local_360;
  puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_278,local_360);
  uVar8 = *puVar6;
  puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_298,local_360);
  printf("scan_seq[%zu]=%d..., scan_par[%zu]=%d...\n",sVar7,(ulong)uVar8,local_360,(ulong)*puVar6);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"incorrect result");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char* argv[]) {

  if(argc != 3) {
    std::cerr << "usage: ./inclusive_scan num_workers num_elements\n"; 
    std::exit(EXIT_FAILURE);
  }

  size_t W = std::atoi(argv[1]);
  size_t N = std::atoi(argv[2]);

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> elements(N), scan_seq(N), scan_par(N);
  for(size_t i=0; i<N; i++) {
    elements[i] = static_cast<int>(i);
  }
  
  // sequential inclusive scan
  {
    std::cout << "sequential inclusive scan ... ";
    auto beg = std::chrono::steady_clock::now();
    std::inclusive_scan(
      elements.begin(), elements.end(), scan_seq.begin(), std::multiplies<int>{}
    );
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(end-beg).count()
              << "ns\n";
  }

  // create a parallel inclusive scan task
  {
    std::cout << "parallel   inclusive scan ... ";
    auto beg = std::chrono::steady_clock::now();
    taskflow.inclusive_scan(
      elements.begin(), elements.end(), scan_par.begin(), std::multiplies<int>{}
    );
    executor.run(taskflow).wait();
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(end-beg).count()
              << "ns\n";
  }

  // verify the result
  for(size_t i=0; i<N; i++) {
    if(scan_seq[i] != scan_par[i]) {
      printf(
        "scan_seq[%zu]=%d..., scan_par[%zu]=%d...\n",
        i, scan_seq[i], i, scan_par[i]
      );
      throw std::runtime_error("incorrect result");
    }
  }

  printf("correct result\n");

  return 0;
}